

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O1

size_t axl::sys::createSimpleTlsSlot(void)

{
  uint_t code;
  size_t sVar1;
  pthread_key_t key;
  uint local_3c;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_38;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_20;
  
  code = pthread_key_create(&local_3c,(__destr_function *)0x0);
  if (code == 0) {
    sVar1 = (size_t)local_3c;
  }
  else {
    err::Error::Error((Error *)&local_20,code);
    local_38.m_p = (ErrorHdr *)0x0;
    local_38.m_hdr = (BufHdr *)0x0;
    local_38.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_38,&local_20);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_20);
    err::setError((ErrorRef *)&local_38);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_38);
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

size_t
createSimpleTlsSlot() {
	pthread_key_t key;
	int result = ::pthread_key_create(&key, NULL);
	if (result != 0) {
		err::setError(result);
		return -1;
	}

	ASSERT(sizeof(key) <= sizeof(size_t));
	return (size_t)key;
}